

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreBroker.cpp
# Opt level: O1

void __thiscall
helics::CoreBroker::sendCommand
          (CoreBroker *this,string_view target,string_view commandStr,HelicsSequencingModes mode)

{
  int iVar1;
  size_t size;
  char *__s1;
  action_t startingAction;
  size_t __n;
  byte *__s1_00;
  size_type __rlen;
  size_type __rlen_1;
  string_view str;
  string_view queryStr;
  ActionMessage cmdcmd;
  string local_108;
  ActionMessage local_e8;
  
  __s1_00 = (byte *)commandStr._M_str;
  size = commandStr._M_len;
  __s1 = target._M_str;
  __n = target._M_len;
  if ((size == 5) && (iVar1 = bcmp(__s1_00,"flush",5), iVar1 == 0)) {
    queryStr._M_str = "global_flush";
    queryStr._M_len = 0xc;
    query_abi_cxx11_(&local_108,this,target,queryStr,HELICS_SEQUENCING_MODE_ORDERED);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p == &local_108.field_2) {
      return;
    }
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
    return;
  }
  startingAction = cmd_send_command;
  if (mode == HELICS_SEQUENCING_MODE_ORDERED) {
    startingAction = cmd_send_command_ordered;
  }
  ActionMessage::ActionMessage(&local_e8,startingAction);
  local_e8.source_id.gid = (this->super_BrokerBase).global_id._M_i.gid;
  local_e8.payload.bufferSize = size;
  if ((local_e8.payload.heap != __s1_00) &&
     (SmallBuffer::reserve(&local_e8.payload,size), size != 0)) {
    memcpy(local_e8.payload.heap,__s1_00,size);
  }
  ActionMessage::setString(&local_e8,0,(string_view)target);
  str._M_str = (this->super_BrokerBase).identifier._M_dataplus._M_p;
  str._M_len = (this->super_BrokerBase).identifier._M_string_length;
  ActionMessage::setString(&local_e8,1,str);
  if ((__n != 6) || (iVar1 = bcmp(__s1,"broker",6), iVar1 != 0)) {
    if ((this->super_BrokerBase).identifier._M_string_length == __n) {
      if ((__n != 0) &&
         (iVar1 = bcmp(__s1,(this->super_BrokerBase).identifier._M_dataplus._M_p,__n), iVar1 != 0))
      {
        if (__n == 10) goto LAB_002f1b9c;
        if (__n == 4) goto LAB_002f1b76;
        goto LAB_002f1bcf;
      }
    }
    else if (__n != 0) {
      if (__n == 4) {
LAB_002f1b76:
        iVar1 = bcmp(__s1,"root",__n);
        if ((iVar1 == 0) && (((this->super_BrokerBase).field_0x293 & 1) != 0)) goto LAB_002f1bbc;
      }
      if (__n == 10) {
LAB_002f1b9c:
        iVar1 = bcmp(__s1,"federation",__n);
        if ((iVar1 == 0) && (((this->super_BrokerBase).field_0x293 & 1) != 0)) goto LAB_002f1bbc;
      }
LAB_002f1bcf:
      transmitToParent(this,&local_e8);
      goto LAB_002f1bdc;
    }
  }
LAB_002f1bbc:
  BrokerBase::addActionMessage(&this->super_BrokerBase,&local_e8);
LAB_002f1bdc:
  ActionMessage::~ActionMessage(&local_e8);
  return;
}

Assistant:

void CoreBroker::sendCommand(std::string_view target,
                             std::string_view commandStr,
                             HelicsSequencingModes mode)
{
    if (commandStr == "flush") {
        query(target, "global_flush", HelicsSequencingModes::HELICS_SEQUENCING_MODE_ORDERED);
        return;
    }
    ActionMessage cmdcmd(mode == HELICS_SEQUENCING_MODE_ORDERED ? CMD_SEND_COMMAND_ORDERED :
                                                                  CMD_SEND_COMMAND);
    cmdcmd.source_id = global_id.load();
    cmdcmd.payload = commandStr;
    cmdcmd.setString(targetStringLoc, target);
    cmdcmd.setString(sourceStringLoc, getIdentifier());

    if (target == "broker" || target == getIdentifier() || target.empty() ||
        (target == "root" && _isRoot) || (target == "federation" && _isRoot)) {
        addActionMessage(std::move(cmdcmd));
    } else {
        transmitToParent(std::move(cmdcmd));
    }
}